

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O0

bool __thiscall CLI::Option::remove_needs(Option *this,Option *opt)

{
  bool bVar1;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_const_iterator<CLI::Option_*> local_30;
  _Self local_28;
  _Rb_tree_const_iterator<CLI::Option_*> iterator;
  Option *opt_local;
  Option *this_local;
  
  iterator._M_node = (_Base_ptr)opt;
  local_30._M_node =
       (_Base_ptr)
       ::std::begin<std::set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>>>
                 (&this->needs_);
  local_38 = (_Base_ptr)
             ::std::end<std::set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>>>
                       (&this->needs_);
  local_28._M_node =
       (_Base_ptr)
       ::std::find<std::_Rb_tree_const_iterator<CLI::Option*>,CLI::Option*>
                 (local_30,(_Rb_tree_const_iterator<CLI::Option_*>)local_38,(Option **)&iterator);
  local_40._M_node =
       (_Base_ptr)
       ::std::end<std::set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>>>
                 (&this->needs_);
  bVar1 = std::operator==(&local_28,&local_40);
  if (!bVar1) {
    ::std::set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>>::erase_abi_cxx11_
              ((set<CLI::Option*,std::less<CLI::Option*>,std::allocator<CLI::Option*>> *)
               &this->needs_,(const_iterator)local_28._M_node);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

CLI11_INLINE bool Option::remove_needs(Option *opt) {
    auto iterator = std::find(std::begin(needs_), std::end(needs_), opt);

    if(iterator == std::end(needs_)) {
        return false;
    }
    needs_.erase(iterator);
    return true;
}